

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O2

Promise<void> kj::anon_unknown_0::expectRead(AsyncInputStream *in,StringPtr expected)

{
  long lVar1;
  SourceLocation location;
  AsyncInputStream AVar2;
  char *pcVar3;
  void *pvVar4;
  long in_RCX;
  AsyncInputStream *pAVar5;
  size_t count;
  SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_test_c__:1197:23)>
  *location_00;
  Promise<unsigned_long> promise;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  Array<char> buffer;
  AsyncInputStream local_88;
  undefined *local_80;
  undefined *puStack_78;
  undefined8 local_70;
  anon_class_48_3_6fe2814c_for_func local_68;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_38;
  
  pAVar5 = (AsyncInputStream *)expected.content.ptr;
  count = in_RCX - 1;
  if (count == 0) {
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)in);
  }
  else {
    pcVar3 = kj::_::HeapArrayDisposer::allocate<char>(count);
    buffer.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    buffer.ptr = pcVar3;
    buffer.size_ = count;
    (*pAVar5->_vptr_AsyncInputStream[1])(&promise,pAVar5,pcVar3,1,count);
    local_68.buffer.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    buffer.ptr = (char *)0x0;
    buffer.size_ = 0;
    continuationTracePtr =
         kj::_::
         SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls-test.c++:1197:23)>
         ::anon_class_48_3_6fe2814c_for_func::operator();
    lVar1 = *(long *)((long)promise.super_PromiseBase.node.ptr + 8);
    local_68.in = pAVar5;
    local_68.expected.content.ptr = (char *)expected.content.size_;
    local_68.buffer.ptr = pcVar3;
    local_68.buffer.size_ = count;
    if (lVar1 == 0 || (ulong)((long)promise.super_PromiseBase.node.ptr - lVar1) < 0x50) {
      pvVar4 = operator_new(0x400);
      location_00 = (SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_test_c__:1197:23)>
                     *)((long)pvVar4 + 0x3b0);
      ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::expectRead(kj::AsyncInputStream&,kj::StringPtr)::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::expectRead(kj::AsyncInputStream&,kj::StringPtr)::__0,void*&>
                (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise,&local_68,
                 &continuationTracePtr);
      *(void **)((long)pvVar4 + 0x3b8) = pvVar4;
    }
    else {
      *(undefined8 *)((long)promise.super_PromiseBase.node.ptr + 8) = 0;
      location_00 = (SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_test_c__:1197:23)>
                     *)((long)promise.super_PromiseBase.node.ptr + -0x50);
      ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::expectRead(kj::AsyncInputStream&,kj::StringPtr)::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::expectRead(kj::AsyncInputStream&,kj::StringPtr)::__0,void*&>
                (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise,&local_68,
                 &continuationTracePtr);
      *(long *)((long)promise.super_PromiseBase.node.ptr + -0x48) = lVar1;
    }
    local_80 = &DAT_003d3151;
    puStack_78 = &DAT_003d31b0;
    local_70 = 0x4c0000058b;
    location.function = &DAT_003d31b0;
    location.fileName = &DAT_003d3151;
    location.lineNumber = 0x58b;
    location.columnNumber = 0x4c;
    intermediate.ptr = (PromiseNode *)location_00;
    kj::_::maybeChain<void>((OwnPromiseNode *)&local_88,(Promise<void> *)&intermediate,location);
    AVar2._vptr_AsyncInputStream = local_88._vptr_AsyncInputStream;
    local_88._vptr_AsyncInputStream = (_func_int **)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_88);
    in->_vptr_AsyncInputStream = (_func_int **)AVar2;
    local_38.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_38);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
    Array<char>::~Array(&local_68.buffer);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
    Array<char>::~Array(&buffer);
  }
  return (Promise<void>)in;
}

Assistant:

kj::Promise<void> expectRead(kj::AsyncInputStream& in, kj::StringPtr expected) {
  if (expected.size() == 0) return kj::READY_NOW;

  auto buffer = kj::heapArray<char>(expected.size());

  auto promise = in.tryRead(buffer.begin(), 1, buffer.size());
  return promise.then([&in,expected,buffer=kj::mv(buffer)](size_t amount) {
    if (amount == 0) {
      KJ_FAIL_ASSERT("expected data never sent", expected);
    }

    auto actual = buffer.first(amount);
    if (actual != expected.asBytes().first(amount)) {
      KJ_FAIL_ASSERT("data from stream doesn't match expected", expected, actual);
    }

    return expectRead(in, expected.slice(amount));
  });
}